

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::CheckIfLoopIsHot(InterpreterStackFrame *this,uint profiledLoopCounter)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  int iVar3;
  FunctionBody *this_00;
  undefined4 *puVar4;
  undefined4 extraout_var;
  char16 *pcVar5;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  
  this_00 = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(this + 0x80));
  if (((this_00->field_0x179 & 0x40) == 0) && (DAT_015bbdac < profiledLoopCounter)) {
    sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
    if ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,JITLoopBodyPhase,sourceContextId,
                              ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.
                               functionInfo.ptr)->functionId);
    if (bVar2) {
      iVar3 = (*(this_00->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this_00);
      pcVar5 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this_00,(wchar (*) [42])local_78);
      Output::Print(L"Speculate Jit set for this function with loopbody: function: %s (%s)\n",
                    CONCAT44(extraout_var,iVar3),pcVar5);
      Output::Flush();
    }
    FunctionBody::SetHasHotLoop(this_00);
  }
  return;
}

Assistant:

void
        InterpreterStackFrame::CheckIfLoopIsHot(uint profiledLoopCounter)
    {
        Js::FunctionBody *fn = this->function->GetFunctionBody();
        if (!fn->GetHasHotLoop() && profiledLoopCounter > (uint)CONFIG_FLAG(JitLoopBodyHotLoopThreshold))
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (PHASE_TRACE(Js::JITLoopBodyPhase, fn))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                Output::Print(
                    _u("Speculate Jit set for this function with loopbody: function: %s (%s)\n"),
                    fn->GetDisplayName(),
                    fn->GetDebugNumberSet(debugStringBuffer));
                Output::Flush();
            }
#endif
            fn->SetHasHotLoop();
        }
    }